

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

void appendColsToLpVectors
               (HighsLp *lp,HighsInt num_new_col,vector<double,_std::allocator<double>_> *colCost,
               vector<double,_std::allocator<double>_> *colLower,
               vector<double,_std::allocator<double>_> *colUpper)

{
  long lVar1;
  int iVar2;
  pointer pHVar3;
  pointer pHVar4;
  pointer pbVar5;
  pointer pbVar6;
  ulong uVar7;
  size_type __new_size;
  ulong uVar8;
  
  if (num_new_col != 0) {
    __new_size = (long)num_new_col + (long)lp->num_col_;
    std::vector<double,_std::allocator<double>_>::resize(&lp->col_cost_,__new_size);
    std::vector<double,_std::allocator<double>_>::resize(&lp->col_lower_,__new_size);
    std::vector<double,_std::allocator<double>_>::resize(&lp->col_upper_,__new_size);
    pHVar3 = (lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pHVar4 = (lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pHVar4 != pHVar3) {
      std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize(&lp->integrality_,__new_size)
      ;
    }
    pbVar5 = (lp->col_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar6 = (lp->col_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar6 != pbVar5) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&lp->col_names_,__new_size);
    }
    uVar8 = 0;
    uVar7 = (ulong)(uint)num_new_col;
    if (num_new_col < 1) {
      uVar7 = uVar8;
    }
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      iVar2 = lp->num_col_;
      lVar1 = uVar8 + (long)iVar2;
      (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar1] =
           (colCost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar8];
      (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar1] =
           (colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar8];
      (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar1] =
           (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar8];
      if (pbVar6 != pbVar5) {
        std::__cxx11::string::assign
                  ((char *)((lp->col_names_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar1));
      }
      if (pHVar4 != pHVar3) {
        (lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8 + (long)iVar2] = kContinuous;
      }
    }
  }
  return;
}

Assistant:

void appendColsToLpVectors(HighsLp& lp, const HighsInt num_new_col,
                           const vector<double>& colCost,
                           const vector<double>& colLower,
                           const vector<double>& colUpper) {
  assert(num_new_col >= 0);
  if (num_new_col == 0) return;
  HighsInt new_num_col = lp.num_col_ + num_new_col;
  lp.col_cost_.resize(new_num_col);
  lp.col_lower_.resize(new_num_col);
  lp.col_upper_.resize(new_num_col);
  const bool have_integrality = (lp.integrality_.size() != 0);
  if (have_integrality) {
    assert(HighsInt(lp.integrality_.size()) == lp.num_col_);
    lp.integrality_.resize(new_num_col);
  }
  bool have_names = (lp.col_names_.size() != 0);
  if (have_names) lp.col_names_.resize(new_num_col);
  for (HighsInt new_col = 0; new_col < num_new_col; new_col++) {
    HighsInt iCol = lp.num_col_ + new_col;
    lp.col_cost_[iCol] = colCost[new_col];
    lp.col_lower_[iCol] = colLower[new_col];
    lp.col_upper_[iCol] = colUpper[new_col];
    // Cannot guarantee to create unique names, so name is blank
    if (have_names) lp.col_names_[iCol] = "";
    if (have_integrality) lp.integrality_[iCol] = HighsVarType::kContinuous;
  }
}